

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

bool __thiscall zmq::pipe_t::check_write(pipe_t *this)

{
  pipe_t *in_RDI;
  bool bVar1;
  bool full;
  bool local_1;
  
  bVar1 = true;
  if ((in_RDI->_out_active & 1U) != 0) {
    bVar1 = in_RDI->_state != active;
  }
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = check_hwm(in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = true;
    }
    else {
      in_RDI->_out_active = false;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool zmq::pipe_t::check_write ()
{
    if (unlikely (!_out_active || _state != active))
        return false;

    const bool full = !check_hwm ();

    if (unlikely (full)) {
        _out_active = false;
        return false;
    }

    return true;
}